

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O2

dtl_error_t dtl_av_sort(dtl_av_t *self,dtl_key_func_t *key,_Bool reverse)

{
  int iVar1;
  void **ppvVar2;
  dtl_sv_t *pdVar3;
  dtl_sv_t *other;
  dtl_dv_type_id dVar4;
  dtl_dv_type_id dVar5;
  dtl_error_t dVar6;
  long lVar7;
  ulong uVar8;
  _Bool local_41;
  ulong local_40;
  ulong local_38;
  
  if (self == (dtl_av_t *)0x0) {
    dVar6 = 1;
  }
  else if (key == (dtl_key_func_t *)0x0) {
    iVar1 = self->pAny->s32CurLen;
    dVar6 = 0;
    if (1 < iVar1) {
      local_38 = (ulong)(iVar1 - 1);
      lVar7 = 1;
      for (local_40 = 0; local_40 != local_38; local_40 = local_40 + 1) {
        local_41 = false;
        ppvVar2 = self->pAny->pFirst;
        pdVar3 = (dtl_sv_t *)ppvVar2[lVar7 + -1];
        if ((pdVar3 == (dtl_sv_t *)0x0) ||
           (other = (dtl_sv_t *)ppvVar2[lVar7], other == (dtl_sv_t *)0x0)) {
          __assert_fail("(left != 0) && (right != 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_av.c"
                        ,0xe6,"dtl_error_t dtl_av_insertion_sort(dtl_av_t *, _Bool)");
        }
        dVar4 = dtl_dv_type((dtl_dv_t *)pdVar3);
        dVar5 = dtl_dv_type((dtl_dv_t *)other);
        if ((dVar4 != DTL_DV_SCALAR) || (dVar5 != DTL_DV_SCALAR)) {
          return 4;
        }
        dVar6 = dtl_sv_lt(pdVar3,other,&local_41);
        if (dVar6 != 0) {
          return dVar6;
        }
        if (reverse) {
          local_41 = (_Bool)(local_41 ^ 1);
        }
        if (local_41 == false) {
          self->pAny->pFirst[lVar7] = pdVar3;
          for (uVar8 = local_40; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
            pdVar3 = (dtl_sv_t *)self->pAny->pFirst[uVar8 - 1];
            dVar4 = dtl_dv_type((dtl_dv_t *)pdVar3);
            if (dVar4 != DTL_DV_SCALAR) {
              return 4;
            }
            dVar6 = dtl_sv_lt(pdVar3,other,&local_41);
            if (dVar6 != 0) {
              return dVar6;
            }
            if (reverse) {
              local_41 = (_Bool)(local_41 ^ 1);
            }
            if (local_41 != false) goto LAB_0013abad;
            self->pAny->pFirst[uVar8] = pdVar3;
          }
          uVar8 = 0;
LAB_0013abad:
          self->pAny->pFirst[(int)uVar8] = other;
        }
        lVar7 = lVar7 + 1;
      }
      dVar6 = 0;
    }
  }
  else {
    dVar6 = 3;
  }
  return dVar6;
}

Assistant:

dtl_error_t dtl_av_sort(dtl_av_t *self, dtl_key_func_t *key, bool reverse)
{
   if (self != 0)
   {
      if (key != 0)
      {
         return DTL_NOT_IMPLEMENTED_ERROR;
      }
      return dtl_av_insertion_sort(self, reverse);
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}